

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeSetPageSize(Btree *p,int pageSize,int nReserve,int iFix)

{
  BtShared *pBt_00;
  BtShared *pBt;
  int rc;
  int iFix_local;
  int nReserve_local;
  int pageSize_local;
  Btree *p_local;
  
  pBt_00 = p->pBt;
  sqlite3BtreeEnter(p);
  if ((pBt_00->btsFlags & 2) == 0) {
    rc = nReserve;
    if (nReserve < 0) {
      rc = pBt_00->pageSize - pBt_00->usableSize;
    }
    if (((0x1ff < pageSize) && (pageSize < 0x10001)) && ((pageSize - 1U & pageSize) == 0)) {
      pBt_00->pageSize = pageSize;
      freeTempSpace(pBt_00);
    }
    p_local._4_4_ = sqlite3PagerSetPagesize(pBt_00->pPager,&pBt_00->pageSize,rc);
    pBt_00->usableSize = pBt_00->pageSize - (rc & 0xffffU);
    if (iFix != 0) {
      pBt_00->btsFlags = pBt_00->btsFlags | 2;
    }
    sqlite3BtreeLeave(p);
  }
  else {
    sqlite3BtreeLeave(p);
    p_local._4_4_ = 8;
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetPageSize(Btree *p, int pageSize, int nReserve, int iFix){
  int rc = SQLITE_OK;
  BtShared *pBt = p->pBt;
  assert( nReserve>=-1 && nReserve<=255 );
  sqlite3BtreeEnter(p);
  if( pBt->btsFlags & BTS_PAGESIZE_FIXED ){
    sqlite3BtreeLeave(p);
    return SQLITE_READONLY;
  }
  if( nReserve<0 ){
    nReserve = pBt->pageSize - pBt->usableSize;
  }
  assert( nReserve>=0 && nReserve<=255 );
  if( pageSize>=512 && pageSize<=SQLITE_MAX_PAGE_SIZE &&
        ((pageSize-1)&pageSize)==0 ){
    assert( (pageSize & 7)==0 );
    assert( !pBt->pPage1 && !pBt->pCursor );
    pBt->pageSize = (u32)pageSize;
    freeTempSpace(pBt);
  }
  rc = sqlite3PagerSetPagesize(pBt->pPager, &pBt->pageSize, nReserve);
  pBt->usableSize = pBt->pageSize - (u16)nReserve;
  if( iFix ) pBt->btsFlags |= BTS_PAGESIZE_FIXED;
  sqlite3BtreeLeave(p);
  return rc;
}